

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

string * __thiscall
pbrt::LanczosSincFilter::ToString_abi_cxx11_(string *__return_storage_ptr__,LanczosSincFilter *this)

{
  FilterSampler *in_R9;
  
  StringPrintf<pbrt::Vector2<float>const&,float_const&,pbrt::FilterSampler_const&>
            (__return_storage_ptr__,(pbrt *)"[ LanczosSincFilter radius: %s tau: %f sampler: %s ]",
             (char *)this,(Vector2<float> *)&this->tau,(float *)&this->sampler,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string LanczosSincFilter::ToString() const {
    return StringPrintf("[ LanczosSincFilter radius: %s tau: %f sampler: %s ]", radius,
                        tau, sampler);
}